

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  byte bVar2;
  int8_t *piVar3;
  int32_t *piVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  ulong *puVar9;
  int *piVar10;
  __m128i round;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i in [512];
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  ulong auStack_2108 [2];
  ulong auStack_20f8 [2];
  undefined8 auStack_20e8 [2];
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  ulong auStack_20c8 [2];
  ulong auStack_20b8 [2];
  undefined8 auStack_20a8 [2];
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  ulong auStack_2088 [2];
  ulong auStack_2078 [2];
  undefined8 auStack_2068 [2];
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  ulong auStack_2048 [2];
  ulong auStack_2038 [2];
  undefined8 local_2028;
  int aiStack_2020 [2046];
  
  piVar3 = av1_fwd_txfm_shift_ls[0xc];
  puVar9 = (ulong *)(input + 0x3c);
  lVar5 = 0xf0;
  do {
    iVar7 = (int)*av1_fwd_txfm_shift_ls[0xc];
    *(ulong *)((long)&uStack_2118 + lVar5) = puVar9[-0xf];
    *(undefined8 *)((long)&uStack_2110 + lVar5) = 0;
    *(ulong *)((long)auStack_2108 + lVar5) = puVar9[-0xe];
    *(undefined8 *)((long)auStack_2108 + lVar5 + 8) = 0;
    *(ulong *)((long)auStack_20f8 + lVar5) = puVar9[-0xd];
    *(undefined8 *)((long)auStack_20f8 + lVar5 + 8) = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = puVar9[-0xc];
    *(undefined1 (*) [16])((long)auStack_20e8 + lVar5) = auVar11;
    auVar11 = pmovsxwd(auVar11,*(undefined8 *)((long)&uStack_2118 + lVar5));
    auVar13 = pmovsxwd(in_XMM1,*(undefined8 *)((long)auStack_2108 + lVar5));
    auVar18 = pmovsxwd(in_XMM2,*(undefined8 *)((long)auStack_20f8 + lVar5));
    auVar23 = pmovsxwd(in_XMM3,*(undefined8 *)((long)auStack_20e8 + lVar5));
    *(int *)((long)&uStack_2118 + lVar5) = auVar11._0_4_ << iVar7;
    *(int *)((long)&uStack_2118 + lVar5 + 4) = auVar11._4_4_;
    *(int *)((long)&uStack_2110 + lVar5) = auVar11._8_4_;
    *(int *)((long)auStack_2108 + lVar5 + -4) = auVar11._12_4_;
    auVar14._0_4_ = auVar13._0_4_ << iVar7;
    auVar14._4_4_ = auVar13._4_4_;
    auVar14._8_4_ = auVar13._8_4_;
    auVar14._12_4_ = auVar13._12_4_;
    *(undefined1 (*) [16])((long)auStack_2108 + lVar5) = auVar14;
    auVar19._0_4_ = auVar18._0_4_ << iVar7;
    auVar19._4_4_ = auVar18._4_4_;
    auVar19._8_4_ = auVar18._8_4_;
    auVar19._12_4_ = auVar18._12_4_;
    *(undefined1 (*) [16])((long)auStack_20f8 + lVar5) = auVar19;
    auVar24._0_4_ = auVar23._0_4_ << iVar7;
    auVar24._4_4_ = auVar23._4_4_;
    auVar24._8_4_ = auVar23._8_4_;
    auVar24._12_4_ = auVar23._12_4_;
    *(undefined1 (*) [16])((long)auStack_20e8 + lVar5) = auVar24;
    iVar7 = (int)*av1_fwd_txfm_shift_ls[0xc];
    *(ulong *)((long)&uStack_20d8 + lVar5) = puVar9[-0xb];
    *(undefined8 *)((long)&uStack_20d0 + lVar5) = 0;
    *(ulong *)((long)auStack_20c8 + lVar5) = puVar9[-10];
    *(undefined8 *)((long)auStack_20c8 + lVar5 + 8) = 0;
    *(ulong *)((long)auStack_20b8 + lVar5) = puVar9[-9];
    *(undefined8 *)((long)auStack_20b8 + lVar5 + 8) = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = puVar9[-8];
    *(undefined1 (*) [16])((long)auStack_20a8 + lVar5) = auVar13;
    auVar11 = pmovsxwd(auVar13,*(undefined8 *)((long)&uStack_20d8 + lVar5));
    auVar13 = pmovsxwd(auVar14,*(undefined8 *)((long)auStack_20c8 + lVar5));
    auVar18 = pmovsxwd(auVar19,*(undefined8 *)((long)auStack_20b8 + lVar5));
    auVar23 = pmovsxwd(auVar24,*(undefined8 *)((long)auStack_20a8 + lVar5));
    *(int *)((long)&uStack_20d8 + lVar5) = auVar11._0_4_ << iVar7;
    *(int *)((long)&uStack_20d8 + lVar5 + 4) = auVar11._4_4_;
    *(int *)((long)&uStack_20d0 + lVar5) = auVar11._8_4_;
    *(int *)((long)auStack_20c8 + lVar5 + -4) = auVar11._12_4_;
    auVar15._0_4_ = auVar13._0_4_ << iVar7;
    auVar15._4_4_ = auVar13._4_4_;
    auVar15._8_4_ = auVar13._8_4_;
    auVar15._12_4_ = auVar13._12_4_;
    *(undefined1 (*) [16])((long)auStack_20c8 + lVar5) = auVar15;
    auVar20._0_4_ = auVar18._0_4_ << iVar7;
    auVar20._4_4_ = auVar18._4_4_;
    auVar20._8_4_ = auVar18._8_4_;
    auVar20._12_4_ = auVar18._12_4_;
    *(undefined1 (*) [16])((long)auStack_20b8 + lVar5) = auVar20;
    auVar25._0_4_ = auVar23._0_4_ << iVar7;
    auVar25._4_4_ = auVar23._4_4_;
    auVar25._8_4_ = auVar23._8_4_;
    auVar25._12_4_ = auVar23._12_4_;
    *(undefined1 (*) [16])((long)auStack_20a8 + lVar5) = auVar25;
    iVar7 = (int)*av1_fwd_txfm_shift_ls[0xc];
    *(ulong *)((long)&uStack_2098 + lVar5) = puVar9[-7];
    *(undefined8 *)((long)&uStack_2090 + lVar5) = 0;
    *(ulong *)((long)auStack_2088 + lVar5) = puVar9[-6];
    *(undefined8 *)((long)auStack_2088 + lVar5 + 8) = 0;
    *(ulong *)((long)auStack_2078 + lVar5) = puVar9[-5];
    *(undefined8 *)((long)auStack_2078 + lVar5 + 8) = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = puVar9[-4];
    *(undefined1 (*) [16])((long)auStack_2068 + lVar5) = auVar18;
    auVar11 = pmovsxwd(auVar18,*(undefined8 *)((long)&uStack_2098 + lVar5));
    auVar13 = pmovsxwd(auVar15,*(undefined8 *)((long)auStack_2088 + lVar5));
    auVar18 = pmovsxwd(auVar20,*(undefined8 *)((long)auStack_2078 + lVar5));
    auVar23 = pmovsxwd(auVar25,*(undefined8 *)((long)auStack_2068 + lVar5));
    *(int *)((long)&uStack_2098 + lVar5) = auVar11._0_4_ << iVar7;
    *(int *)((long)&uStack_2098 + lVar5 + 4) = auVar11._4_4_;
    *(int *)((long)&uStack_2090 + lVar5) = auVar11._8_4_;
    *(int *)((long)auStack_2088 + lVar5 + -4) = auVar11._12_4_;
    auVar16._0_4_ = auVar13._0_4_ << iVar7;
    auVar16._4_4_ = auVar13._4_4_;
    auVar16._8_4_ = auVar13._8_4_;
    auVar16._12_4_ = auVar13._12_4_;
    *(undefined1 (*) [16])((long)auStack_2088 + lVar5) = auVar16;
    auVar21._0_4_ = auVar18._0_4_ << iVar7;
    auVar21._4_4_ = auVar18._4_4_;
    auVar21._8_4_ = auVar18._8_4_;
    auVar21._12_4_ = auVar18._12_4_;
    *(undefined1 (*) [16])((long)auStack_2078 + lVar5) = auVar21;
    auVar26._0_4_ = auVar23._0_4_ << iVar7;
    auVar26._4_4_ = auVar23._4_4_;
    auVar26._8_4_ = auVar23._8_4_;
    auVar26._12_4_ = auVar23._12_4_;
    *(undefined1 (*) [16])((long)auStack_2068 + lVar5) = auVar26;
    iVar7 = (int)*av1_fwd_txfm_shift_ls[0xc];
    *(ulong *)((long)&uStack_2058 + lVar5) = puVar9[-3];
    *(undefined8 *)((long)&uStack_2050 + lVar5) = 0;
    *(ulong *)((long)auStack_2048 + lVar5) = puVar9[-2];
    *(undefined8 *)((long)auStack_2048 + lVar5 + 8) = 0;
    *(ulong *)((long)auStack_2038 + lVar5) = puVar9[-1];
    *(undefined8 *)((long)auStack_2038 + lVar5 + 8) = 0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *puVar9;
    *(undefined1 (*) [16])((long)&local_2028 + lVar5) = auVar23;
    auVar11 = pmovsxwd(auVar23,*(undefined8 *)((long)&uStack_2058 + lVar5));
    auVar13 = pmovsxwd(auVar16,*(undefined8 *)((long)auStack_2048 + lVar5));
    auVar18 = pmovsxwd(auVar21,*(undefined8 *)((long)auStack_2038 + lVar5));
    auVar23 = pmovsxwd(auVar26,*(undefined8 *)((long)&local_2028 + lVar5));
    *(int *)((long)&uStack_2058 + lVar5) = auVar11._0_4_ << iVar7;
    *(int *)((long)&uStack_2058 + lVar5 + 4) = auVar11._4_4_;
    *(int *)((long)&uStack_2050 + lVar5) = auVar11._8_4_;
    *(int *)((long)auStack_2048 + lVar5 + -4) = auVar11._12_4_;
    in_XMM1._0_4_ = auVar13._0_4_ << iVar7;
    in_XMM1._4_4_ = auVar13._4_4_;
    in_XMM1._8_4_ = auVar13._8_4_;
    in_XMM1._12_4_ = auVar13._12_4_;
    in_XMM2._0_4_ = auVar18._0_4_ << iVar7;
    in_XMM2._4_4_ = auVar18._4_4_;
    in_XMM2._8_4_ = auVar18._8_4_;
    in_XMM2._12_4_ = auVar18._12_4_;
    *(undefined1 (*) [16])((long)auStack_2048 + lVar5) = in_XMM1;
    *(undefined1 (*) [16])((long)auStack_2038 + lVar5) = in_XMM2;
    in_XMM3._0_4_ = auVar23._0_4_ << iVar7;
    in_XMM3._4_4_ = auVar23._4_4_;
    in_XMM3._8_4_ = auVar23._8_4_;
    in_XMM3._12_4_ = auVar23._12_4_;
    *(undefined1 (*) [16])((long)&local_2028 + lVar5) = in_XMM3;
    puVar9 = (ulong *)((long)puVar9 + (long)stride * 2);
    lVar5 = lVar5 + 0x100;
  } while (lVar5 != 0x20f0);
  lVar5 = 0;
  do {
    auStack_2038[1] = 0x428241;
    av1_fdct32_sse4_1((__m128i *)((long)&local_2028 + lVar5),(__m128i *)((long)&local_2028 + lVar5),
                      0xc,0x10);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    auStack_2038[1] = 0x428261;
    col_txfm_16x16_rounding((__m128i *)((long)&local_2028 + lVar5),-(int)piVar3[1]);
    lVar5 = lVar5 + 0x400;
  } while (lVar5 != 0x2000);
  piVar4 = coeff + 0x60;
  piVar6 = aiStack_2020 + 0xbe;
  lVar5 = 0;
  do {
    lVar8 = -0x80;
    piVar10 = piVar6;
    do {
      auVar11 = *(undefined1 (*) [16])(piVar10 + -0xc0);
      auVar13 = *(undefined1 (*) [16])(piVar10 + -0x40);
      auVar27._0_8_ = auVar11._0_8_;
      auVar27._8_4_ = auVar11._4_4_;
      auVar27._12_4_ = piVar10[-0x7f];
      auVar12._0_8_ = CONCAT44(piVar10[-0x7e],auVar11._8_4_);
      auVar12._8_4_ = auVar11._12_4_;
      auVar12._12_4_ = piVar10[-0x7d];
      iVar7 = *piVar10;
      auVar30._0_8_ = auVar13._0_8_;
      auVar30._8_4_ = auVar13._4_4_;
      auVar30._12_4_ = piVar10[1];
      auVar22._0_8_ = CONCAT44(piVar10[2],auVar13._8_4_);
      auVar22._8_4_ = auVar13._12_4_;
      auVar22._12_4_ = piVar10[3];
      puVar1 = (undefined8 *)((long)piVar4 + lVar8 + -0x100);
      *puVar1 = CONCAT44(piVar10[-0x80],auVar11._0_4_);
      puVar1[1] = CONCAT44(iVar7,auVar13._0_4_);
      auVar28._8_8_ = auVar30._8_8_;
      auVar28._0_8_ = auVar27._8_8_;
      *(undefined1 (*) [16])((long)piVar4 + lVar8 + -0x80) = auVar28;
      auVar17._8_8_ = auVar22._0_8_;
      auVar17._0_8_ = auVar12._0_8_;
      *(undefined1 (*) [16])((long)piVar4 + lVar8) = auVar17;
      puVar1 = (undefined8 *)((long)piVar4 + lVar8 + 0x80);
      *puVar1 = auVar12._8_8_;
      puVar1[1] = auVar22._8_8_;
      piVar10 = piVar10 + 0x100;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0);
    lVar5 = lVar5 + 1;
    piVar4 = piVar4 + 0x80;
    piVar6 = piVar6 + 4;
  } while (lVar5 != 0x10);
  lVar5 = 0;
  do {
    auStack_2038[1] = 0x42833a;
    av1_fdct64_sse4_1((__m128i *)((long)coeff + lVar5),(__m128i *)((long)&local_2028 + lVar5),'\v',8
                      ,8);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x80);
  bVar2 = piVar3[2];
  if ((char)bVar2 < '\0') {
    iVar7 = 1 << (~bVar2 & 0x1f);
    lVar5 = 0;
    auVar11 = ZEXT416((uint)-(int)(char)bVar2);
    auVar13 = pmovsxwd(auVar22,0x16a116a116a116a1);
    auVar18 = pmovsxwd(auVar28,0x800080008000800);
    do {
      auVar31._0_4_ = *(int *)((long)&local_2028 + lVar5) + iVar7 >> auVar11;
      auVar31._4_4_ = *(int *)((long)aiStack_2020 + lVar5 + -4) + iVar7 >> auVar11;
      auVar31._8_4_ = *(int *)((long)aiStack_2020 + lVar5) + iVar7 >> auVar11;
      auVar31._12_4_ = *(int *)((long)aiStack_2020 + lVar5 + 4) + iVar7 >> auVar11;
      auVar23 = pmulld(auVar31,auVar13);
      piVar6 = (int *)((long)coeff + lVar5);
      *piVar6 = auVar23._0_4_ + auVar18._0_4_ >> 0xc;
      piVar6[1] = auVar23._4_4_ + auVar18._4_4_ >> 0xc;
      piVar6[2] = auVar23._8_4_ + auVar18._8_4_ >> 0xc;
      piVar6[3] = auVar23._12_4_ + auVar18._12_4_ >> 0xc;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x2000);
  }
  else {
    lVar5 = 0;
    auVar11 = pmovsxwd(auVar17,0x16a116a116a116a1);
    auVar13 = pmovsxwd(auVar22,0x800080008000800);
    do {
      auVar29._0_4_ = *(int *)((long)&local_2028 + lVar5) << (int)(char)bVar2;
      auVar29._4_4_ = *(undefined4 *)((long)aiStack_2020 + lVar5 + -4);
      auVar29._8_4_ = *(undefined4 *)((long)aiStack_2020 + lVar5);
      auVar29._12_4_ = *(undefined4 *)((long)aiStack_2020 + lVar5 + 4);
      auVar18 = pmulld(auVar29,auVar11);
      piVar6 = (int *)((long)coeff + lVar5);
      *piVar6 = auVar18._0_4_ + auVar13._0_4_ >> 0xc;
      piVar6[1] = auVar18._4_4_ + auVar13._4_4_ >> 0xc;
      piVar6[2] = auVar18._8_4_ + auVar13._8_4_ >> 0xc;
      piVar6[3] = auVar18._12_4_ + auVar13._12_4_ >> 0xc;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x2000);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X32];
  const int txw_idx = get_txw_idx(TX_64X32);
  const int txh_idx = get_txh_idx(TX_64X32);
  const int txfm_size_col = tx_size_wide[TX_64X32];
  const int txfm_size_row = tx_size_high[TX_64X32];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  for (int i = 0; i < 32; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * 16, 4, 0, 0, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * 16, 4, 0, 0,
                    shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct32_sse4_1((in + i), (in + i), bitcol, num_col);
  }

  for (int i = 0; i < num_row; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_col), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct64_sse4_1((outcoef128 + i), (in + i), bitrow, num_row, num_row);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 512, -shift[2],
                                       NewSqrt2);
  (void)bd;
}